

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdBitmask<wabt::interp::Simd<int,(unsigned_char)4>>(Thread *this)

{
  Simd<int,_(unsigned_char)__x04_> SVar1;
  
  SVar1 = Pop<wabt::interp::Simd<int,(unsigned_char)4>>(this);
  Push<unsigned_int>(this,SVar1.v[3] >> 0x1f & 8U | SVar1.v[1] >> 0x1f & 2U |
                          SVar1.v[2] >> 0x1f & 4U | SVar1.v[0] >> 0x1f & 1U);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBitmask() {
  auto val = Pop<S>();
  u32 result = 0;
  for (u8 i = 0; i < S::lanes; ++i) {
    if (val[i] < 0) {
      result |= 1 << i;
    }
  }
  Push(result);
  return RunResult::Ok;
}